

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

int __thiscall
cmsys::RegExpFind::regtry(RegExpFind *this,char *string,char **start,char **end,char *prog)

{
  int iVar1;
  long lVar2;
  
  this->reginput = string;
  this->regstartp = start;
  this->regendp = end;
  for (lVar2 = 0; (int)lVar2 != 10; lVar2 = lVar2 + 1) {
    start[lVar2] = (char *)0x0;
    end[lVar2] = (char *)0x0;
  }
  iVar1 = regmatch(this,prog + 1);
  if (iVar1 != 0) {
    *start = string;
    *end = this->reginput;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int RegExpFind::regtry(const char* string, const char** start,
                       const char** end, const char* prog)
{
  int i;
  const char** sp1;
  const char** ep;

  reginput = string;
  regstartp = start;
  regendp = end;

  sp1 = start;
  ep = end;
  for (i = RegularExpressionMatch::NSUBEXP; i > 0; i--) {
    *sp1++ = KWSYS_NULLPTR;
    *ep++ = KWSYS_NULLPTR;
  }
  if (regmatch(prog + 1)) {
    start[0] = string;
    end[0] = reginput;
    return (1);
  } else
    return (0);
}